

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glfwinfo.c
# Opt level: O0

void usage(void)

{
  printf("Usage: glfwinfo [OPTION]...\n");
  printf("Options:\n");
  printf("  -a, --client-api=API      the client API to use (gl or es)\n");
  printf("  -b, --behavior=BEHAVIOR   the release behavior to use (none or flush)\n");
  printf("  -d, --debug               request a debug context\n");
  printf("  -f, --forward             require a forward-compatible context\n");
  printf("  -h, --help                show this help\n");
  printf("  -l, --list-extensions     list all client API extensions\n");
  printf("  -m, --major=MAJOR         the major number of the required client API version\n");
  printf("  -n, --minor=MINOR         the minor number of the required client API version\n");
  printf("  -p, --profile=PROFILE     the OpenGL profile to use (core or compat)\n");
  printf("  -s, --robustness=STRATEGY the robustness strategy to use (none or lose)\n");
  printf("  -v, --version             print version information\n");
  printf("      --red-bits=N          the number of red bits to request\n");
  printf("      --green-bits=N        the number of green bits to request\n");
  printf("      --blue-bits=N         the number of blue bits to request\n");
  printf("      --alpha-bits=N        the number of alpha bits to request\n");
  printf("      --depth-bits=N        the number of depth bits to request\n");
  printf("      --stencil-bits=N      the number of stencil bits to request\n");
  printf("      --accum-red-bits=N    the number of red bits to request\n");
  printf("      --accum-green-bits=N  the number of green bits to request\n");
  printf("      --accum-blue-bits=N   the number of blue bits to request\n");
  printf("      --accum-alpha-bits=N  the number of alpha bits to request\n");
  printf("      --aux-buffers=N       the number of aux buffers to request\n");
  printf("      --samples=N           the number of MSAA samples to request\n");
  printf("      --stereo              request stereo rendering\n");
  printf("      --srgb                request an sRGB capable framebuffer\n");
  printf("      --singlebuffer        request single-buffering\n");
  return;
}

Assistant:

static void usage(void)
{
    printf("Usage: glfwinfo [OPTION]...\n");
    printf("Options:\n");
    printf("  -a, --client-api=API      the client API to use ("
                                        API_NAME_OPENGL " or "
                                        API_NAME_OPENGL_ES ")\n");
    printf("  -b, --behavior=BEHAVIOR   the release behavior to use ("
                                        BEHAVIOR_NAME_NONE " or "
                                        BEHAVIOR_NAME_FLUSH ")\n");
    printf("  -d, --debug               request a debug context\n");
    printf("  -f, --forward             require a forward-compatible context\n");
    printf("  -h, --help                show this help\n");
    printf("  -l, --list-extensions     list all client API extensions\n");
    printf("  -m, --major=MAJOR         the major number of the required "
                                        "client API version\n");
    printf("  -n, --minor=MINOR         the minor number of the required "
                                        "client API version\n");
    printf("  -p, --profile=PROFILE     the OpenGL profile to use ("
                                        PROFILE_NAME_CORE " or "
                                        PROFILE_NAME_COMPAT ")\n");
    printf("  -s, --robustness=STRATEGY the robustness strategy to use ("
                                        STRATEGY_NAME_NONE " or "
                                        STRATEGY_NAME_LOSE ")\n");
    printf("  -v, --version             print version information\n");
    printf("      --red-bits=N          the number of red bits to request\n");
    printf("      --green-bits=N        the number of green bits to request\n");
    printf("      --blue-bits=N         the number of blue bits to request\n");
    printf("      --alpha-bits=N        the number of alpha bits to request\n");
    printf("      --depth-bits=N        the number of depth bits to request\n");
    printf("      --stencil-bits=N      the number of stencil bits to request\n");
    printf("      --accum-red-bits=N    the number of red bits to request\n");
    printf("      --accum-green-bits=N  the number of green bits to request\n");
    printf("      --accum-blue-bits=N   the number of blue bits to request\n");
    printf("      --accum-alpha-bits=N  the number of alpha bits to request\n");
    printf("      --aux-buffers=N       the number of aux buffers to request\n");
    printf("      --samples=N           the number of MSAA samples to request\n");
    printf("      --stereo              request stereo rendering\n");
    printf("      --srgb                request an sRGB capable framebuffer\n");
    printf("      --singlebuffer        request single-buffering\n");
}